

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Expr * __thiscall parser::Parser::parseExpression(Parser *this)

{
  bool bVar1;
  reference ppEVar2;
  value_type e;
  Parser *this_local;
  
  expand(this);
  bVar1 = hasErrors(this);
  if (bVar1) {
    this_local = (Parser *)0x0;
  }
  else {
    ppEVar2 = std::stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::top
                        (&this->Operands);
    this_local = (Parser *)*ppEVar2;
    std::stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::pop
              (&this->Operands);
  }
  return (Expr *)this_local;
}

Assistant:

Expr* Parser::parseExpression()
{
    expand();
    if(hasErrors())
        return nullptr;
    auto e = Operands.top();
    Operands.pop();
    return e;
}